

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall QSslSocketPrivate::_q_bytesWrittenSlot(QSslSocketPrivate *this,qint64 written)

{
  QObject *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  qint64 local_30;
  void *local_28;
  qint64 *pqStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8;
  if (this->mode == UnencryptedMode) {
    QIODevice::bytesWritten((longlong)pQVar1);
  }
  else {
    pqStack_20 = &local_30;
    local_28 = (void *)0x0;
    local_30 = written;
    QMetaObject::activate(pQVar1,&QSslSocket::staticMetaObject,4,&local_28);
  }
  if (((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state == ClosingState) &&
     ((lVar2 = *(long *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x98,
      lVar2 == 0 || (*(long *)(lVar2 + 0x18) == 0)))) {
    (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_bytesWrittenSlot(qint64 written)
{
    Q_Q(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_bytesWrittenSlot(" << written << ')';
#endif

    if (mode == QSslSocket::UnencryptedMode)
        emit q->bytesWritten(written);
    else
        emit q->encryptedBytesWritten(written);
    if (state == QAbstractSocket::ClosingState && writeBuffer.isEmpty())
        q->disconnectFromHost();
}